

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall
el::base::utils::RegistryWithPred<el::Configuration,_el::Configuration::Predicate>::unregisterAll
          (RegistryWithPred<el::Configuration,_el::Configuration::Predicate> *this)

{
  Configuration **ppCVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  Configuration **curr;
  Configuration **pointer;
  undefined4 extraout_var_00;
  
  iVar2 = (*(this->
            super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
            ).super_ThreadSafe._vptr_ThreadSafe[9])();
  if ((char)iVar2 == '\0') {
    iVar2 = (*(this->
              super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[0xb])(this);
    ppCVar1 = (Configuration **)((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
    for (pointer = *(Configuration ***)CONCAT44(extraout_var,iVar2); pointer != ppCVar1;
        pointer = pointer + 1) {
      safeDelete<el::Configuration>(pointer);
    }
    iVar2 = (*(this->
              super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[0xb])(this);
    plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
    if (plVar3[1] != *plVar3) {
      plVar3[1] = *plVar3;
    }
  }
  return;
}

Assistant:

virtual void unregisterAll(void) ELPP_FINAL {
    if (!this->empty()) {
      for (auto&& curr : this->list()) {
        base::utils::safeDelete(curr);
      }
      this->list().clear();
    }
  }